

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager_worker.c
# Opt level: O3

apx_error_t
apx_fileManagerWorker_prepare_send_open_file_request(apx_fileManagerWorker_t *self,uint32_t address)

{
  adt_buf_err_t aVar1;
  int iVar2;
  apx_command_t cmd;
  undefined4 local_48;
  uint32_t uStack_44;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (self != (apx_fileManagerWorker_t *)0x0) {
    uStack_40 = 0;
    local_38 = 0;
    uStack_30 = 0;
    _local_48 = CONCAT44(address,5);
    pthread_spin_lock(&self->queue_lock);
    aVar1 = adt_rbfh_insert(&self->queue,(uint8_t *)&local_48);
    pthread_spin_unlock(&self->queue_lock);
    sem_post((sem_t *)&self->semaphore);
    iVar2 = 0x26;
    if (aVar1 != '\x02') {
      iVar2 = (uint)(aVar1 == '\x01') * 2;
    }
    return iVar2;
  }
  return 1;
}

Assistant:

apx_error_t apx_fileManagerWorker_prepare_send_open_file_request(apx_fileManagerWorker_t* self, uint32_t address)
{
   if (self != NULL)
   {
      adt_buf_err_t rc;
      apx_command_t cmd = { APX_CMD_OPEN_REMOTE_FILE, 0, 0, {0}, 0 };
      cmd.data1 = address;
      SPINLOCK_ENTER(self->queue_lock);
      rc = adt_rbfh_insert(&self->queue, (const uint8_t*)&cmd);
      SPINLOCK_LEAVE(self->queue_lock);
#ifndef UNIT_TEST
      SEMAPHORE_POST(self->semaphore);
#endif
      return apx_fileManagerWorker_process_ringbuffer_error(rc);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}